

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

void mime_subparts_free(void *ptr)

{
  curl_mimepart *part;
  
  if ((ptr != (void *)0x0) &&
     (part = *(curl_mimepart **)((long)ptr + 8), part != (curl_mimepart *)0x0)) {
    part->freefunc = (curl_free_callback)0x0;
    cleanup_part_content(part);
  }
  curl_mime_free((curl_mime *)ptr);
  return;
}

Assistant:

static void mime_subparts_free(void *ptr)
{
  curl_mime *mime = (curl_mime *) ptr;

  if(mime && mime->parent) {
    mime->parent->freefunc = NULL;  /* Be sure we won't be called again. */
    cleanup_part_content(mime->parent);  /* Avoid dangling pointer in part. */
  }
  curl_mime_free(mime);
}